

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

LY_ERR lyd_validate_new(lyd_node **first,lysc_node *sparent,lys_module *mod,lysc_ext_instance *ext,
                       uint32_t val_opts,uint32_t int_opts,ly_ht *getnext_ht,lyd_node **diff)

{
  ly_bool lVar1;
  int iVar2;
  lys_module *plVar3;
  lys_module *local_48;
  lysc_node *last_dflt_schema;
  lyd_node *node;
  LY_ERR rc;
  LY_ERR r;
  uint32_t int_opts_local;
  uint32_t val_opts_local;
  lysc_ext_instance *ext_local;
  lys_module *mod_local;
  lysc_node *sparent_local;
  lyd_node **first_local;
  
  node._0_4_ = LY_SUCCESS;
  local_48 = (lys_module *)0x0;
  rc = int_opts;
  r = val_opts;
  _int_opts_local = ext;
  ext_local = (lysc_ext_instance *)mod;
  mod_local = (lys_module *)sparent;
  sparent_local = (lysc_node *)first;
  if ((first == (lyd_node **)0x0) || ((sparent == (lysc_node *)0x0 && (mod == (lys_module *)0x0))))
  {
    __assert_fail("first && (sparent || mod)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0x3af,
                  "LY_ERR lyd_validate_new(struct lyd_node **, const struct lysc_node *, const struct lys_module *, const struct lysc_ext_instance *, uint32_t, uint32_t, struct ly_ht *, struct lyd_node **)"
                 );
  }
  node._4_4_ = lyd_validate_choice_r(first,sparent,mod,ext,val_opts,int_opts,getnext_ht,diff);
  if ((node._4_4_ != LY_SUCCESS) &&
     ((node._4_4_ != LY_EVALID || (node._0_4_ = LY_EVALID, (r & LY_EEXIST) == LY_SUCCESS)))) {
    return node._4_4_;
  }
  last_dflt_schema = *(lysc_node **)sparent_local;
LAB_0022a2ed:
  while( true ) {
    if (last_dflt_schema == (lysc_node *)0x0) {
      return (LY_ERR)node;
    }
    if (last_dflt_schema->module == (lys_module *)0x0) {
      return (LY_ERR)node;
    }
    if ((ext_local != (lysc_ext_instance *)0x0) &&
       (plVar3 = lyd_owner_module((lyd_node *)last_dflt_schema), plVar3 != (lys_module *)ext_local))
    {
      return (LY_ERR)node;
    }
    if ((*(uint *)last_dflt_schema->hash & 5) != 0) break;
    last_dflt_schema = last_dflt_schema->next;
  }
  iVar2 = lyd_val_has_default((lysc_node *)last_dflt_schema->module);
  if (((iVar2 != 0) && (last_dflt_schema->module != local_48)) &&
     ((*(uint *)last_dflt_schema->hash & 4) != 0)) goto code_r0x0022a36a;
  goto LAB_0022a3c8;
code_r0x0022a36a:
  local_48 = last_dflt_schema->module;
  if (*(short *)&last_dflt_schema->module->ctx == 8) {
    lVar1 = lyd_validate_autodel_leaflist_dflt
                      ((lyd_node **)sparent_local,(lyd_node **)&last_dflt_schema,
                       (lys_module *)ext_local,diff);
  }
  else {
    lVar1 = lyd_validate_autodel_cont_leaf_dflt
                      ((lyd_node **)sparent_local,(lyd_node **)&last_dflt_schema,
                       (lys_module *)ext_local,diff);
  }
  if (lVar1 == '\0') {
LAB_0022a3c8:
    if ((*(uint *)last_dflt_schema->hash & 4) != 0) {
      node._4_4_ = lyd_validate_duplicates
                             (*(lyd_node **)sparent_local,(lyd_node *)last_dflt_schema,r);
      if (node._4_4_ != LY_SUCCESS) {
        if (node._4_4_ != LY_EVALID) {
          return node._4_4_;
        }
        node._0_4_ = LY_EVALID;
        if ((r & LY_EEXIST) == LY_SUCCESS) {
          return LY_EVALID;
        }
      }
      *(uint *)last_dflt_schema->hash = *(uint *)last_dflt_schema->hash & 0xfffffffb;
    }
    if (((*(uint *)last_dflt_schema->hash & 1) == 0) ||
       (lVar1 = lyd_validate_autodel_case_dflt
                          ((lyd_node **)sparent_local,(lyd_node **)&last_dflt_schema,
                           (lys_module *)ext_local,diff), lVar1 == '\0')) {
      last_dflt_schema = last_dflt_schema->next;
    }
  }
  goto LAB_0022a2ed;
}

Assistant:

LY_ERR
lyd_validate_new(struct lyd_node **first, const struct lysc_node *sparent, const struct lys_module *mod,
        const struct lysc_ext_instance *ext, uint32_t val_opts, uint32_t int_opts, struct ly_ht *getnext_ht,
        struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    struct lyd_node *node;
    const struct lysc_node *last_dflt_schema = NULL;

    assert(first && (sparent || mod));

    /* validate choices */
    r = lyd_validate_choice_r(first, sparent, mod, ext, val_opts, int_opts, getnext_ht, diff);
    LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

    node = *first;
    while (node) {
        if (!node->schema || (mod && (lyd_owner_module(node) != mod))) {
            /* opaque node or all top-level data from this module checked */
            break;
        }

        if (!(node->flags & (LYD_NEW | LYD_DEFAULT))) {
            /* check only new and default nodes */
            node = node->next;
            continue;
        }

        if (lyd_val_has_default(node->schema) && (node->schema != last_dflt_schema) && (node->flags & LYD_NEW)) {
            /* remove old default(s) of the new node if an explicit instance exists */
            last_dflt_schema = node->schema;
            if (node->schema->nodetype == LYS_LEAFLIST) {
                if (lyd_validate_autodel_leaflist_dflt(first, &node, mod, diff)) {
                    continue;
                }
            } else {
                if (lyd_validate_autodel_cont_leaf_dflt(first, &node, mod, diff)) {
                    continue;
                }
            }
        }

        if (node->flags & LYD_NEW) {
            /* then check new node instance duplicities */
            r = lyd_validate_duplicates(*first, node, val_opts);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* this node is valid */
            node->flags &= ~LYD_NEW;
        }

        if (node->flags & LYD_DEFAULT) {
            /* remove leftover default nodes from a no-longer existing case */
            if (lyd_validate_autodel_case_dflt(first, &node, mod, diff)) {
                continue;
            }
        }

        /* next iter */
        node = node->next;
    }

cleanup:
    return rc;
}